

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O0

void CVmBifTIO::inputkey(uint argc)

{
  uint uVar1;
  int iVar2;
  char extc;
  int evt;
  size_t len;
  char c [10];
  char buf [32];
  char *namebuf;
  CVmConsole *in_stack_ffffffffffffff90;
  CVmConsoleMain *pCVar3;
  size_t in_stack_ffffffffffffff98;
  undefined1 *paramlen;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  int *in_stack_ffffffffffffffa8;
  int evt_00;
  CVmConsole *in_stack_ffffffffffffffb0;
  CVmConsole *this;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int *in_stack_ffffffffffffffc0;
  long lVar4;
  undefined6 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  CVmFormatter *in_stack_ffffffffffffffe0;
  
  CVmBif::check_argc(0,0x2adbf3);
  namebuf = (char *)0x0;
  iVar2 = CVmConsole::read_event_script
                    ((CVmConsole *)
                     CONCAT17(in_stack_ffffffffffffffcf,
                              CONCAT16(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8)),
                     in_stack_ffffffffffffffc0,
                     (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (size_t)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                     in_stack_ffffffffffffffa4,(unsigned_long *)in_stack_ffffffffffffffe0);
  if (iVar2 == 0) {
    (*(G_console_X->super_CVmConsole)._vptr_CVmConsole[3])(G_console_X,1);
    if (G_net_config_X == (TadsNetConfig *)0x0) {
      iVar2 = os_getc_raw();
      lVar4 = 1;
      if ((char)iVar2 == '\0') {
        os_getc_raw();
        evt_00 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
        map_ext_key(namebuf,0);
        iVar2 = (int)((ulong)namebuf >> 0x20);
      }
      else {
        while( true ) {
          iVar2 = raw_key_complete((char *)in_stack_ffffffffffffff90,(size_t)namebuf);
          uVar1 = in_stack_ffffffffffffffa4 & 0xffffff;
          if (iVar2 == 0) {
            uVar1 = CONCAT13(lVar4 + 1U < 10,(int3)in_stack_ffffffffffffffa4);
          }
          in_stack_ffffffffffffffa4 = uVar1;
          if ((char)(in_stack_ffffffffffffffa4 >> 0x18) == '\0') break;
          iVar2 = os_getc_raw();
          (&stack0xffffffffffffffce)[lVar4] = (char)iVar2;
          lVar4 = lVar4 + 1;
        }
        (&stack0xffffffffffffffce)[lVar4] = 0;
        map_raw_key((char *)in_stack_ffffffffffffffa8,
                    (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff98);
        iVar2 = (int)((ulong)namebuf >> 0x20);
        evt_00 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
      }
      CVmConsole::reset_line_count(in_stack_ffffffffffffff90,iVar2);
      paramlen = &stack0xffffffffffffffd8;
      pCVar3 = G_console_X;
      strlen(&stack0xffffffffffffffd8);
      CVmConsole::log_event
                (in_stack_ffffffffffffffb0,evt_00,
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (size_t)paramlen,(int)((ulong)pCVar3 >> 0x20));
      CVmBif::retval_str((char *)pCVar3);
    }
    else {
      CVmBif::retval_ui_str((char *)in_stack_ffffffffffffff90);
    }
  }
  else {
    CVmBif::retval_ui_str((char *)in_stack_ffffffffffffff90);
    iVar2 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
    this = (CVmConsole *)&stack0xffffffffffffffd8;
    pCVar3 = G_console_X;
    strlen(&stack0xffffffffffffffd8);
    CVmConsole::log_event
              (this,(int)((ulong)pCVar3 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98,iVar2);
  }
  return;
}

Assistant:

void CVmBifTIO::inputkey(VMG_ uint argc)
{
    char buf[32];
    char c[10];
    size_t len;
    int evt;
    static const int filter[] = { OS_EVT_KEY };

    /* check arguments */
    check_argc(vmg_ argc, 0);

    /* check for script input */
    if (G_console->read_event_script(
        vmg_ &evt, buf, sizeof(buf),
        filter, sizeof(filter)/sizeof(filter[0]), 0))
    {
        /* we got a key from the script */
        retval_ui_str(vmg_ buf);

        /* log the event */
        G_console->log_event(vmg_ OS_EVT_KEY, buf, strlen(buf), FALSE);

        /* done */
        return;
    }

    /* flush any output */
    G_console->flush_all(vmg_ VM_NL_INPUT);
    
    /* there's no console in web host mode - simply return eof */
    if (G_net_config != 0)
    {
        retval_ui_str(vmg_ "[eof]");
        return;
    }

    /* get a keystroke */
    c[0] = (char)os_getc_raw();
    len = 1;
    
    /* if it's an extended key, map it specially */
    if (c[0] == 0)
    {
        char extc;
        
        /* get the second part of the sequence */
        extc = (char)os_getc_raw();
        
        /* map the extended key */
        map_ext_key(vmg_ buf, (unsigned char)extc);
    }
    else
    {
        /* continue fetching bytes until we have a full character */
        while (!raw_key_complete(vmg_ c, len) && len + 1 < sizeof(c))
        {
            /* 
             *   We don't yet have enough bytes for a complete character, so
             *   read another raw byte.  The keyboard driver should already
             *   have queued up all of the bytes we need to complete the
             *   character sequence, so there should never be a delay from
             *   os_getc_raw() here - it should simply return the next byte
             *   of the sequence immediately.  
             */
            c[len++] = (char)os_getc_raw();
        }
        c[len] = '\0';
        
        /* 
         *   translate the key from the local character set to UTF-8, and map
         *   the extended key code to the portable representation 
         */
        map_raw_key(vmg_ buf, c, len);
    }
    
    /* reset the [MORE] counter */
    G_console->reset_line_count(FALSE);
    
    /* log the event */
    G_console->log_event(vmg_ OS_EVT_KEY, buf, strlen(buf), TRUE);
    
    /* return the string */
    retval_str(vmg_ buf);
}